

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayref.h
# Opt level: O1

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::ReportSuffix<double>
          (BasicProblem<mp::BasicProblemParams<int>_> *this,SuffixDef<double> *sufdef,
          ArrayRef<double> *values)

{
  double *pdVar1;
  BasicMutSuffix<double> BVar2;
  long lVar3;
  
  if (values->size_ != 0) {
    BVar2 = FindOrCreateSuffix<double>(this,sufdef);
    lVar3 = (long)*(int *)((long)BVar2.super_BasicSuffix<double>.super_SuffixBase.impl_ + 0x14);
    if (lVar3 != 0) {
      pdVar1 = values->data_;
      do {
        *(double *)
         (*(long *)((long)BVar2.super_BasicSuffix<double>.super_SuffixBase.impl_ + 0x18) + -8 +
         lVar3 * 8) = pdVar1[lVar3 + -1];
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
  }
  return;
}

Assistant:

bool empty() const { return 0 == size(); }